

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O1

void __thiscall
sglr::ReferenceContext::deleteRenderbuffers
          (ReferenceContext *this,int numRenderbuffers,deUint32 *renderbuffers)

{
  Renderbuffer *renderbuffer;
  ulong uVar1;
  
  if (0 < numRenderbuffers) {
    uVar1 = 0;
    do {
      if (renderbuffers[uVar1] == 0) {
        renderbuffer = (Renderbuffer *)0x0;
      }
      else {
        renderbuffer = rc::ObjectManager<sglr::rc::Renderbuffer>::find
                                 (&this->m_renderbuffers,renderbuffers[uVar1]);
      }
      if (renderbuffer != (Renderbuffer *)0x0) {
        deleteRenderbuffer(this,renderbuffer);
      }
      uVar1 = uVar1 + 1;
    } while ((uint)numRenderbuffers != uVar1);
  }
  return;
}

Assistant:

void ReferenceContext::deleteRenderbuffers (int numRenderbuffers, const deUint32* renderbuffers)
{
	for (int i = 0; i < numRenderbuffers; i++)
	{
		deUint32		name			= renderbuffers[i];
		Renderbuffer*	renderbuffer	= name ? m_renderbuffers.find(name) : DE_NULL;

		if (renderbuffer)
			deleteRenderbuffer(renderbuffer);
	}
}